

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O1

REF_STATUS
ref_recon_extrapolate_zeroth(REF_GRID ref_grid,REF_DBL *recon,REF_BOOL *replace,REF_INT ldim)

{
  long lVar1;
  int iVar2;
  REF_NODE ref_node;
  REF_ADJ pRVar3;
  REF_INT *pRVar4;
  REF_ADJ_ITEM pRVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  REF_BOOL *pRVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  REF_INT remain;
  REF_EDGE ref_edge;
  int local_7c;
  REF_NODE local_78;
  REF_EDGE local_70;
  int local_64;
  REF_GRID local_60;
  long local_58;
  REF_EDGE local_50;
  long local_48;
  REF_GLOB *local_40;
  long local_38;
  
  ref_node = ref_grid->node;
  uVar6 = ref_edge_create(&local_50,ref_grid);
  if (uVar6 == 0) {
    local_78 = ref_node;
    local_60 = ref_grid;
    uVar6 = ref_node_ghost_int(ref_node,replace,ldim);
    if (uVar6 == 0) {
      uVar6 = ref_node_ghost_dbl(local_78,recon,ldim);
      if (uVar6 == 0) {
        local_7c = 1;
        uVar10 = (ulong)(uint)ldim;
        local_48 = uVar10 * 4;
        iVar7 = 0;
        do {
          if (0 < local_78->max) {
            local_40 = local_78->global;
            local_70 = local_50;
            uVar6 = 0;
            lVar11 = 0;
            do {
              if ((-1 < local_40[lVar11]) &&
                 (local_78->ref_mpi->id == local_78->part[lVar11] && 0 < ldim)) {
                local_38 = lVar11 * uVar10;
                uVar13 = 0;
                do {
                  lVar1 = uVar13 + local_38;
                  if (replace[lVar1] != 0) {
                    pRVar3 = local_50->adj;
                    iVar12 = pRVar3->nnode;
                    iVar15 = -1;
                    uVar8 = 0xffffffff;
                    if (lVar11 < iVar12) {
                      uVar8 = (ulong)(uint)pRVar3->first[lVar11];
                    }
                    iVar14 = (int)uVar8;
                    if (iVar14 != -1) {
                      iVar15 = pRVar3->item[iVar14].ref;
                    }
                    if (iVar14 == -1) {
                      iVar14 = 0;
                    }
                    else {
                      iVar14 = 0;
                      do {
                        iVar14 = iVar14 + (uint)(replace[(int)((local_50->e2n[iVar15 * 2] + uVar6 +
                                                               local_50->e2n[iVar15 * 2 + 1]) * ldim
                                                              + (int)uVar13)] == 0);
                        iVar2 = pRVar3->item[(int)uVar8].next;
                        uVar8 = (ulong)iVar2;
                        if (uVar8 == 0xffffffffffffffff) {
                          iVar15 = -1;
                        }
                        else {
                          iVar15 = pRVar3->item[uVar8].ref;
                        }
                      } while (iVar2 != -1);
                    }
                    if (iVar14 != 0) {
                      recon[lVar1] = 0.0;
                      uVar8 = 0xffffffff;
                      if (lVar11 < iVar12) {
                        uVar8 = (ulong)(uint)pRVar3->first[lVar11];
                      }
                      if ((int)uVar8 != -1) {
                        iVar12 = pRVar3->item[(int)uVar8].ref;
                        pRVar4 = local_50->e2n;
                        pRVar5 = pRVar3->item;
                        do {
                          iVar12 = (pRVar4[iVar12 * 2] + uVar6 + pRVar4[iVar12 * 2 + 1]) * ldim +
                                   (int)uVar13;
                          if (replace[iVar12] == 0) {
                            recon[lVar1] = recon[iVar12] + recon[lVar1];
                          }
                          iVar15 = pRVar5[(int)uVar8].next;
                          uVar8 = (ulong)iVar15;
                          if (uVar8 == 0xffffffffffffffff) {
                            iVar12 = -1;
                          }
                          else {
                            iVar12 = pRVar5[uVar8].ref;
                          }
                        } while (iVar15 != -1);
                      }
                      recon[lVar1] = recon[lVar1] / (double)iVar14;
                      replace[lVar1] = 0;
                    }
                  }
                  uVar13 = uVar13 + 1;
                  local_58 = lVar11;
                } while (uVar13 != uVar10);
              }
              lVar1 = lVar11 + 1;
              uVar6 = ~(uint)lVar11;
              lVar11 = lVar1;
            } while (lVar1 < local_78->max);
          }
          local_64 = iVar7;
          uVar6 = ref_node_ghost_int(local_78,replace,ldim);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x462,"ref_recon_extrapolate_zeroth",(ulong)uVar6,"update ghosts");
            return uVar6;
          }
          uVar6 = ref_node_ghost_dbl(local_78,recon,ldim);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x463,"ref_recon_extrapolate_zeroth",(ulong)uVar6,"update ghosts");
            return uVar6;
          }
          local_7c = 0;
          if (0 < local_78->max) {
            iVar7 = 0;
            lVar11 = 0;
            pRVar9 = replace;
            do {
              if ((-1 < local_78->global[lVar11]) &&
                 (local_78->ref_mpi->id == local_78->part[lVar11] && 0 < ldim)) {
                uVar13 = 0;
                do {
                  if (pRVar9[uVar13] != 0) {
                    iVar7 = iVar7 + 1;
                    local_7c = iVar7;
                  }
                  uVar13 = uVar13 + 1;
                } while (uVar10 != uVar13);
              }
              lVar11 = lVar11 + 1;
              pRVar9 = (REF_BOOL *)((long)pRVar9 + local_48);
            } while (lVar11 < local_78->max);
          }
          uVar6 = ref_mpi_allsum(local_60->mpi,&local_7c,1,1);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x46d,"ref_recon_extrapolate_zeroth",(ulong)uVar6,"sum updates");
            return uVar6;
          }
        } while ((local_7c != 0) && (iVar7 = local_64 + 1, iVar7 != 10));
        ref_edge_free(local_50);
        uVar6 = 0;
        if ((0 < local_7c) && (local_60->mpi->id == 0)) {
          uVar6 = 0;
          printf(" %d remain\n");
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x476,"ref_recon_extrapolate_zeroth","untouched boundary nodes remain");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x442,"ref_recon_extrapolate_zeroth",(ulong)uVar6,"update ghosts");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x441
             ,"ref_recon_extrapolate_zeroth",(ulong)uVar6,"update ghosts");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x43f,
           "ref_recon_extrapolate_zeroth",(ulong)uVar6,"edges");
  }
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_recon_extrapolate_zeroth(REF_GRID ref_grid,
                                                REF_DBL *recon,
                                                REF_BOOL *replace,
                                                REF_INT ldim) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node, item, edge;
  REF_EDGE ref_edge;
  REF_INT i, neighbor, nint;
  REF_INT pass, remain;

  RSS(ref_edge_create(&ref_edge, ref_grid), "edges");

  RSS(ref_node_ghost_int(ref_node, replace, ldim), "update ghosts");
  RSS(ref_node_ghost_dbl(ref_node, recon, ldim), "update ghosts");

  remain = 1;
  for (pass = 0; pass < 10; pass++) {
    each_ref_node_valid_node(ref_node, node) {
      if (ref_node_owned(ref_node, node)) {
        for (i = 0; i < ldim; i++) {
          if (replace[i + ldim * node]) {
            nint = 0;
            each_edge_having_node(ref_edge, node, item, edge) {
              neighbor = ref_edge_e2n(ref_edge, 0, edge) +
                         ref_edge_e2n(ref_edge, 1, edge) - node;
              if (!replace[i + ldim * neighbor]) nint++;
            }
            if (0 < nint) {
              recon[i + ldim * node] = 0.0;
              each_edge_having_node(ref_edge, node, item, edge) {
                neighbor = ref_edge_e2n(ref_edge, 0, edge) +
                           ref_edge_e2n(ref_edge, 1, edge) - node;
                if (!replace[i + ldim * neighbor]) {
                  recon[i + ldim * node] += recon[i + ldim * neighbor];
                }
              }
              /* use Euclidean average, these are derivatives */
              recon[i + ldim * node] /= (REF_DBL)nint;
              replace[i + ldim * node] = REF_FALSE;
            }
          }
        }
      }
    }

    RSS(ref_node_ghost_int(ref_node, replace, ldim), "update ghosts");
    RSS(ref_node_ghost_dbl(ref_node, recon, ldim), "update ghosts");
    remain = 0;
    each_ref_node_valid_node(ref_node, node) {
      if (ref_node_owned(ref_node, node)) {
        for (i = 0; i < ldim; i++) {
          if (replace[i + ldim * node]) remain++;
        }
      }
    }
    RSS(ref_mpi_allsum(ref_grid_mpi(ref_grid), &remain, 1, REF_INT_TYPE),
        "sum updates");

    if (0 == remain) break;
  }

  ref_edge_free(ref_edge);

  if (0 < remain && ref_mpi_once(ref_grid_mpi(ref_grid))) {
    printf(" %d remain\n", remain);
    REF_WHERE("untouched boundary nodes remain");
  }

  return REF_SUCCESS;
}